

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O0

void language::formatConnection
               (QTextStream *str,SignalSlot *sender,SignalSlot *receiver,
               ConnectionSyntax connectionSyntax)

{
  bool bVar1;
  Language LVar2;
  qsizetype qVar3;
  QTextStream *pQVar4;
  QStringView *this;
  CaseSensitivity cs;
  int in_ECX;
  QString *in_RDX;
  QString *in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar5;
  qsizetype paren;
  QStringView parameters;
  QStringView senderSignature;
  SignalSlot *in_stack_ffffffffffffff28;
  SignalSlotOption flag;
  QStringView *in_stack_ffffffffffffff30;
  QString *in_stack_ffffffffffffff38;
  QStringView *this_00;
  undefined4 in_stack_ffffffffffffff50;
  QChar ch;
  undefined1 in_stack_ffffffffffffff58 [16];
  QStringView *local_98;
  QChar local_5a [9];
  QStringView *local_48;
  storage_type_conflict *local_40;
  QChar local_32;
  QStringView local_30;
  QStringView local_20;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  LVar2 = language();
  if (LVar2 == Cpp) {
    if (in_ECX == 0) {
      formatStringBasedConnection
                ((QTextStream *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (SignalSlot *)0x1953f1);
    }
    else if (in_ECX == 1) {
      formatMemberFnPtrConnection
                ((QTextStream *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (SignalSlot *)0x1953db);
    }
  }
  else if (LVar2 == Python) {
    this_00 = (QStringView *)(in_RSI + 1);
    QChar::QChar<char16_t,_true>(&local_a,L'(');
    flag = (SignalSlotOption)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    qVar3 = QString::indexOf(in_stack_ffffffffffffff38,(QChar)in_stack_ffffffffffffff58._6_2_,
                             (qsizetype)in_stack_ffffffffffffff30,flag);
    local_20.m_size = -0x5555555555555556;
    local_20.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    QStringView::QStringView<QString,_true>(this_00,in_stack_ffffffffffffff38);
    pQVar4 = (QTextStream *)QTextStream::operator<<(in_RDI,in_RSI);
    this = (QStringView *)QTextStream::operator<<(pQVar4,'.');
    QVar5 = QStringView::left(this,(qsizetype)this_00);
    local_98 = (QStringView *)QVar5.m_size;
    QTextStream::operator<<((QTextStream *)this,local_98);
    bVar1 = QFlags<language::SignalSlotOption>::testFlag
                      ((QFlags<language::SignalSlotOption> *)in_stack_ffffffffffffff30,flag);
    if (bVar1) {
      local_30.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_30.m_size = 0xaaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff38 = (QString *)(qVar3 + 1);
      QStringView::size(&local_20);
      local_30 = QStringView::mid(this,in_stack_ffffffffffffff58._0_8_,
                                  CONCAT44(LVar2,in_stack_ffffffffffffff50));
      bVar1 = QStringView::isEmpty((QStringView *)0x19554b);
      if (!bVar1) {
        QChar::QChar<char16_t,_true>(&local_32,L',');
        bVar1 = QStringView::contains
                          (in_stack_ffffffffffffff30,(QChar)(char16_t)((ulong)this >> 0x30),flag);
        if (!bVar1) {
          pQVar4 = (QTextStream *)QTextStream::operator<<(in_RDI,"[\"");
          local_48 = (QStringView *)local_30.m_size;
          local_40 = local_30.m_data;
          pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QStringView *)local_30.m_size);
          QTextStream::operator<<(pQVar4,"\"]");
        }
      }
    }
    ch.ucs = in_stack_ffffffffffffff58._6_2_;
    pQVar4 = (QTextStream *)QTextStream::operator<<(in_RDI,".connect(");
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,in_RDX);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,'.');
    QStringView::QStringView<QString,_true>(this_00,in_stack_ffffffffffffff38);
    cs = (CaseSensitivity)((ulong)(in_RDX + 1) >> 0x20);
    QChar::QChar<char16_t,_true>(local_5a,L'(');
    QString::indexOf(in_stack_ffffffffffffff38,ch,(qsizetype)pQVar4,cs);
    QVar5 = QStringView::left(this,(qsizetype)this_00);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QStringView *)QVar5.m_size);
    QTextStream::operator<<(pQVar4,')');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void formatConnection(QTextStream &str, const SignalSlot &sender, const SignalSlot &receiver,
                      ConnectionSyntax connectionSyntax)
{
    switch (language()) {
    case Language::Cpp:
        switch (connectionSyntax) {
        case ConnectionSyntax::MemberFunctionPtr:
            formatMemberFnPtrConnection(str, sender, receiver);
            break;
        case ConnectionSyntax::StringBased:
            formatStringBasedConnection(str, sender, receiver);
            break;
        }
        break;
    case Language::Python: {
        const auto paren = sender.signature.indexOf(u'(');
        auto senderSignature = QStringView{sender.signature};
        str << sender.name << '.' << senderSignature.left(paren);
        // Signals like "QAbstractButton::clicked(checked=false)" require
        // the parameter if it is used.
        if (sender.options.testFlag(SignalSlotOption::Ambiguous)) {
            const QStringView parameters =
                senderSignature.mid(paren + 1, senderSignature.size() - paren - 2);
            if (!parameters.isEmpty() && !parameters.contains(u','))
                str << "[\"" << parameters << "\"]";
        }
        str << ".connect(" << receiver.name << '.'
            << QStringView{receiver.signature}.left(receiver.signature.indexOf(u'('))
            << ')';
    }
        break;
    }
}